

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

void __thiscall MeCab::anon_unknown_0::TaggerImpl::initRequestType(TaggerImpl *this)

{
  Lattice *pLVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lattice *pLVar3;
  
  pLVar3 = (this->lattice_).ptr_;
  if (pLVar3 == (Lattice *)0x0) {
    iVar2 = (*(this->current_model_->super_Model)._vptr_Model[4])();
    pLVar3 = (Lattice *)CONCAT44(extraout_var,iVar2);
    pLVar1 = (this->lattice_).ptr_;
    if (pLVar1 != (Lattice *)0x0) {
      (*pLVar1->_vptr_Lattice[0x27])();
    }
    (this->lattice_).ptr_ = pLVar3;
  }
  (*pLVar3->_vptr_Lattice[0x13])(pLVar3,(ulong)(uint)this->request_type_);
  pLVar3 = (this->lattice_).ptr_;
  if (pLVar3 == (Lattice *)0x0) {
    iVar2 = (*(this->current_model_->super_Model)._vptr_Model[4])();
    pLVar3 = (Lattice *)CONCAT44(extraout_var_00,iVar2);
    pLVar1 = (this->lattice_).ptr_;
    if (pLVar1 != (Lattice *)0x0) {
      (*pLVar1->_vptr_Lattice[0x27])();
    }
    (this->lattice_).ptr_ = pLVar3;
  }
  (*pLVar3->_vptr_Lattice[0xe])((float)this->theta_,pLVar3);
  return;
}

Assistant:

void initRequestType() {
    mutable_lattice()->set_request_type(request_type_);
    mutable_lattice()->set_theta(theta_);
  }